

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::captureValues<unsigned_long_long>
          (Capturer *this,size_t index,unsigned_long_long *value)

{
  string local_38;
  
  StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
            (&local_38,(StringMaker<unsigned_long_long,void> *)*value,(unsigned_long_long)value);
  captureValue(this,index,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }